

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O1

string * __thiscall
soul::heart::Printer::PrinterStream::getTypeDescription_abi_cxx11_
          (string *__return_storage_ptr__,PrinterStream *this,Type *type)

{
  uint uVar1;
  Type t;
  Type local_28;
  pool_ptr<const_soul::Module> local_10;
  
  local_10.object = this->module;
  uVar1._0_1_ = type->category;
  uVar1._1_1_ = type->arrayElementCategory;
  uVar1._2_1_ = type->isRef;
  uVar1._3_1_ = type->isConstant;
  local_28.primitiveType.type = (type->primitiveType).type;
  local_28.boundingSize = type->boundingSize;
  local_28.arrayElementBoundingSize = type->arrayElementBoundingSize;
  local_28.structure.object = (type->structure).object;
  if (local_28.structure.object != (Structure *)0x0) {
    ((local_28.structure.object)->super_RefCountedObject).refCount =
         ((local_28.structure.object)->super_RefCountedObject).refCount + 1;
  }
  local_28._0_4_ = uVar1 & 0xffffff;
  Program::ProgramImpl::getTypeDescriptionWithQualificationIfNeeded_abi_cxx11_
            (__return_storage_ptr__,((local_10.object)->program).pimpl,&local_10,&local_28);
  RefCountedPtr<soul::Structure>::decIfNotNull(local_28.structure.object);
  return __return_storage_ptr__;
}

Assistant:

std::string getTypeDescription (const Type& type) const
        {
            return module.program.getTypeDescriptionWithQualificationIfNeeded (module, type.removeConstIfPresent());
        }